

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

bool Js::AsmJsFunctionDeclaration::Is(AsmJsSymbol *sym)

{
  bool bVar1;
  undefined1 local_11;
  AsmJsSymbol *sym_local;
  
  bVar1 = AsmJsFunc::Is(sym);
  local_11 = true;
  if (!bVar1) {
    bVar1 = AsmJsFunctionTable::Is(sym);
    local_11 = true;
    if (!bVar1) {
      bVar1 = AsmJsImportFunction::Is(sym);
      local_11 = true;
      if (!bVar1) {
        bVar1 = AsmJsMathFunction::Is(sym);
        local_11 = true;
        if (!bVar1) {
          bVar1 = AsmJsTypedArrayFunction::Is(sym);
          local_11 = true;
          if (!bVar1) {
            local_11 = AsmJsClosureFunction::Is(sym);
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool AsmJsFunctionDeclaration::Is(AsmJsSymbol* sym)
    {
        return (
            AsmJsFunc::Is(sym) ||
            AsmJsFunctionTable::Is(sym) ||
            AsmJsImportFunction::Is(sym) ||
            AsmJsMathFunction::Is(sym) ||
            AsmJsTypedArrayFunction::Is(sym) ||
            AsmJsClosureFunction::Is(sym)
        );
    }